

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O0

void boost::deflate::deflate_stream_test::testFlushPartial(ICompressor *c)

{
  runner *prVar1;
  undefined8 uVar2;
  bool bVar3;
  const_pointer pcVar4;
  size_type sVar5;
  undefined8 uVar6;
  runner **pprVar7;
  undefined1 auVar8 [16];
  undefined1 auStack_68 [8];
  error_code ec;
  undefined1 local_50 [8];
  string_view s;
  string local_30 [8];
  string out;
  ICompressor *c_local;
  
  out.field_2._8_8_ = c;
  (**c->_vptr_ICompressor)();
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::resize((ulong)local_30);
  basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_50,"Hello");
  uVar2 = out.field_2._8_8_;
  pcVar4 = basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_50);
  (**(code **)(*(long *)uVar2 + 0x28))(uVar2,pcVar4);
  uVar2 = out.field_2._8_8_;
  sVar5 = basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_50);
  (**(code **)(*(long *)uVar2 + 0x18))(uVar2,sVar5);
  uVar2 = out.field_2._8_8_;
  uVar6 = std::__cxx11::string::front();
  (**(code **)(*(long *)uVar2 + 0x48))(uVar2,uVar6);
  uVar2 = out.field_2._8_8_;
  uVar6 = std::__cxx11::string::size();
  (**(code **)(*(long *)uVar2 + 0x38))(uVar2,uVar6);
  system::error_code::error_code((error_code *)auStack_68);
  auVar8 = (**(code **)(*(long *)out.field_2._8_8_ + 0x60))(out.field_2._8_8_,0);
  ec._0_8_ = auVar8._8_8_;
  auStack_68 = auVar8._0_8_;
  pprVar7 = test_suite::detail::current();
  prVar1 = *pprVar7;
  bVar3 = system::error_code::operator_cast_to_bool((error_code *)auStack_68);
  test_suite::detail::runner::maybe_fail<bool>
            (prVar1,!bVar3,"!ec",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
             ,0x1f0,
             "static void boost::deflate::deflate_stream_test::testFlushPartial(ICompressor &)",
             (char *)0x0);
  auVar8 = (**(code **)(*(long *)out.field_2._8_8_ + 0x60))(out.field_2._8_8_,2);
  ec._0_8_ = auVar8._8_8_;
  auStack_68 = auVar8._0_8_;
  pprVar7 = test_suite::detail::current();
  prVar1 = *pprVar7;
  bVar3 = system::error_code::operator_cast_to_bool((error_code *)auStack_68);
  test_suite::detail::runner::maybe_fail<bool>
            (prVar1,!bVar3,"!ec",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
             ,0x1f2,
             "static void boost::deflate::deflate_stream_test::testFlushPartial(ICompressor &)",
             (char *)0x0);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

static
    void testFlushPartial(ICompressor& c)
    {
        c.init();
        std::string out;
        out.resize(1024);
        string_view s = "Hello";
        c.next_in(s.data());
        c.avail_in(s.size());
        c.next_out(&out.front());
        c.avail_out(out.size());
        error_code ec;
        ec = c.write(Flush::none);
        BOOST_TEST(!ec);
        ec = c.write(Flush::partial);
        BOOST_TEST(!ec);
    }